

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSGlue::emitPostES6(Wasm2JSGlue *this)

{
  Name *pNVar1;
  __node_base_ptr *pp_Var2;
  char cVar3;
  ExternalKind EVar4;
  Output *pOVar5;
  pointer puVar6;
  _Head_base<0UL,_wasm::Function_*,_false> _Var7;
  char *pcVar8;
  pointer puVar9;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var10;
  pointer puVar11;
  _Head_base<0UL,_wasm::Table_*,_false> _Var12;
  Module *pMVar13;
  _Head_base<0UL,_wasm::Export_*,_false> _Var14;
  long lVar15;
  Wasm2JSGlue *pWVar16;
  ostream *poVar17;
  size_type sVar18;
  Module *pMVar19;
  pointer puVar20;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *import_1;
  pointer puVar21;
  long lVar22;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar23;
  pointer puVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_270;
  ostringstream export_name;
  long local_260 [12];
  ios_base local_200 [264];
  undefined1 local_f8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  __node_base local_b0 [2];
  pointer local_a0;
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  Wasm2JSGlue *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pMVar19 = this->wasm;
  puVar21 = (pMVar19->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar21 !=
       (pMVar19->memories).
       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (*(char **)((long)&((puVar21->_M_t).
                         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                        super_Importable + 0x20) != (char *)0x0)) {
    pOVar5 = this->out;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar5 + 0x200),"var mem",7);
    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(pOVar5 + 0x200),(this->moduleName).super_IString.str._M_str,
                         (this->moduleName).super_IString.str._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," = new ArrayBuffer(",0x13);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)poVar17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,");\n",3);
  }
  pOVar5 = this->out;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar5 + 0x200),"var ret",7);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(pOVar5 + 0x200),(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," = ",3);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar17,(this->moduleName).super_IString.str._M_str,
                       (this->moduleName).super_IString.str._M_len);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"({\n",3);
  local_f8 = (undefined1  [8])&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)0x1;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  puVar6 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  for (puVar23 = (this->wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar23 != puVar6; puVar23 = puVar23 + 1
      ) {
    _Var7._M_head_impl =
         (puVar23->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar8 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x30);
      iVar33 = (int)pcVar8;
      iVar34 = (int)((ulong)pcVar8 >> 0x20);
      pMVar19 = (Module *)CONCAT71(0x1a56,_finalize == pcVar8);
      auVar40._0_4_ = -(uint)((int)_visitCall == iVar33);
      auVar40._4_4_ = -(uint)((int)((ulong)_visitCall >> 0x20) == iVar34);
      auVar40._8_4_ = -(uint)((int)_finalize == iVar33);
      auVar40._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar48._4_4_ = auVar40._0_4_;
      auVar48._0_4_ = auVar40._4_4_;
      auVar48._8_4_ = auVar40._12_4_;
      auVar48._12_4_ = auVar40._8_4_;
      auVar42._0_4_ = -(uint)((int)_finalize == iVar33);
      auVar42._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar42._8_4_ = -(uint)((int)UINT16ARRAY == iVar33);
      auVar42._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar34);
      auVar41._4_4_ = auVar42._0_4_;
      auVar41._0_4_ = auVar42._4_4_;
      auVar41._8_4_ = auVar42._12_4_;
      auVar41._12_4_ = auVar42._8_4_;
      auVar42 = packssdw(auVar41 & auVar42,auVar48 & auVar40);
      auVar45._0_4_ = -(uint)((int)_parseExpression == iVar33);
      auVar45._4_4_ = -(uint)((int)((ulong)_parseExpression >> 0x20) == iVar34);
      auVar45._8_4_ = -(uint)((int)_visitSIMDShift == iVar33);
      auVar45._12_4_ = -(uint)((int)((ulong)_visitSIMDShift >> 0x20) == iVar34);
      auVar35._4_4_ = auVar45._0_4_;
      auVar35._0_4_ = auVar45._4_4_;
      auVar35._8_4_ = auVar45._12_4_;
      auVar35._12_4_ = auVar45._8_4_;
      auVar28._0_4_ = -(uint)((int)_finalize == iVar33);
      auVar28._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar28._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar33);
      auVar28._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar34);
      auVar27._4_4_ = auVar28._0_4_;
      auVar27._0_4_ = auVar28._4_4_;
      auVar27._8_4_ = auVar28._12_4_;
      auVar27._12_4_ = auVar28._8_4_;
      auVar28 = packssdw(auVar27 & auVar28,auVar35 & auVar45);
      auVar28 = packssdw(auVar28,auVar42);
      if ((((((((((((auVar28 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar28 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar28 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar28 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar28[0xf]) && (cashew::TRSHIFT != pcVar8)) && (cashew::SET != pcVar8)) &&
          ((_visitRefTest != pcVar8 && (_Init != pcVar8)))) &&
         ((_finalize != pcVar8 && (pMVar19 = (Module *)&ABI::wasm2js::TRAP, __M_create != pcVar8))))
      {
        pNVar1 = (Name *)((long)&(_Var7._M_head_impl)->super_Importable + 0x18);
        sVar18 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_f8,pNVar1);
        if (sVar18 == 0) {
          pOVar5 = local_58->out;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar5 + 0x200),"  \"",3);
          name.super_IString.str._M_str = (char *)pMVar19;
          name.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x20);
          poVar17 = wasm::operator<<((wasm *)(pOVar5 + 0x200),
                                     *(ostream **)
                                      &((Name *)((long)&(_Var7._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\": ",3);
          pcVar8 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x20);
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar8,
                     pcVar8 + *(long *)&((Name *)((long)&(_Var7._M_head_impl)->super_Importable +
                                                 0x18))->super_IString);
          ::wasm::asmangle(&local_270,&local_50);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,(char *)local_270,_export_name);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,",\n",2);
          if (local_270 !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          local_270 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)local_f8;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    (local_270,pNVar1,&local_270);
        }
      }
    }
  }
  puVar9 = (local_58->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar21 = (local_58->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar9; puVar21 = puVar21 + 1
      ) {
    _Var10._M_head_impl =
         (puVar21->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar8 = *(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x30);
      iVar33 = (int)pcVar8;
      iVar34 = (int)((ulong)pcVar8 >> 0x20);
      pMVar19 = (Module *)CONCAT71(0x1a56,_finalize == pcVar8);
      auVar43._0_4_ = -(uint)((int)_visitCall == iVar33);
      auVar43._4_4_ = -(uint)((int)((ulong)_visitCall >> 0x20) == iVar34);
      auVar43._8_4_ = -(uint)((int)_finalize == iVar33);
      auVar43._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar49._4_4_ = auVar43._0_4_;
      auVar49._0_4_ = auVar43._4_4_;
      auVar49._8_4_ = auVar43._12_4_;
      auVar49._12_4_ = auVar43._8_4_;
      auVar36._0_4_ = -(uint)((int)_finalize == iVar33);
      auVar36._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar36._8_4_ = -(uint)((int)UINT16ARRAY == iVar33);
      auVar36._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar34);
      auVar44._4_4_ = auVar36._0_4_;
      auVar44._0_4_ = auVar36._4_4_;
      auVar44._8_4_ = auVar36._12_4_;
      auVar44._12_4_ = auVar36._8_4_;
      auVar45 = packssdw(auVar44 & auVar36,auVar49 & auVar43);
      auVar29._0_4_ = -(uint)((int)_parseExpression == iVar33);
      auVar29._4_4_ = -(uint)((int)((ulong)_parseExpression >> 0x20) == iVar34);
      auVar29._8_4_ = -(uint)((int)_visitSIMDShift == iVar33);
      auVar29._12_4_ = -(uint)((int)((ulong)_visitSIMDShift >> 0x20) == iVar34);
      auVar37._4_4_ = auVar29._0_4_;
      auVar37._0_4_ = auVar29._4_4_;
      auVar37._8_4_ = auVar29._12_4_;
      auVar37._12_4_ = auVar29._8_4_;
      auVar25._0_4_ = -(uint)((int)_finalize == iVar33);
      auVar25._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar25._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar33);
      auVar25._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar34);
      auVar30._4_4_ = auVar25._0_4_;
      auVar30._0_4_ = auVar25._4_4_;
      auVar30._8_4_ = auVar25._12_4_;
      auVar30._12_4_ = auVar25._8_4_;
      auVar28 = packssdw(auVar30 & auVar25,auVar37 & auVar29);
      auVar28 = packssdw(auVar28,auVar45);
      if (((((((((((auVar28 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar28 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar28 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar28 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar28[0xf]) && (cashew::TRSHIFT != pcVar8)) &&
          ((cashew::SET != pcVar8 &&
           (((_visitRefTest != pcVar8 && (_Init != pcVar8)) && (_finalize != pcVar8)))))) &&
         (pMVar19 = (Module *)&ABI::wasm2js::TRAP, __M_create != pcVar8)) {
        pOVar5 = local_58->out;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar5 + 0x200),"  \"",3);
        name_00.super_IString.str._M_str = (char *)pMVar19;
        name_00.super_IString.str._M_len =
             (size_t)*(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x20);
        poVar17 = wasm::operator<<((wasm *)(pOVar5 + 0x200),
                                   *(ostream **)
                                    &((Name *)((long)&(_Var10._M_head_impl)->super_Importable + 0x18
                                              ))->super_IString,name_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\": {\n",5);
        pOVar5 = local_58->out;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar5 + 0x200),"    ",4);
        pcVar8 = *(char **)((long)&(_Var10._M_head_impl)->super_Importable + 0x30);
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pcVar8,
                   pcVar8 + *(long *)&((Name *)((long)&(_Var10._M_head_impl)->super_Importable +
                                               0x28))->super_IString);
        ::wasm::asmangle(&local_270,&local_50);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(pOVar5 + 0x200),(char *)local_270,_export_name);
        pWVar16 = local_58;
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,": { buffer : mem",0x10);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,(pWVar16->moduleName).super_IString.str._M_str,
                             (pWVar16->moduleName).super_IString.str._M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," }\n",3);
        if (local_270 !=
            (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             *)local_260) {
          operator_delete(local_270,local_260[0] + 1);
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(pWVar16->out + 0x200),"  },\n",5);
      }
    }
  }
  puVar11 = (local_58->wasm->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar24 = (local_58->wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pWVar16 = local_58, puVar24 != puVar11;
      puVar24 = puVar24 + 1) {
    _Var12._M_head_impl =
         (puVar24->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&(_Var12._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      pcVar8 = *(char **)((long)&(_Var12._M_head_impl)->super_Importable + 0x30);
      iVar33 = (int)pcVar8;
      iVar34 = (int)((ulong)pcVar8 >> 0x20);
      pMVar19 = (Module *)CONCAT71(0x1a56,_finalize == pcVar8);
      auVar46._0_4_ = -(uint)((int)_visitCall == iVar33);
      auVar46._4_4_ = -(uint)((int)((ulong)_visitCall >> 0x20) == iVar34);
      auVar46._8_4_ = -(uint)((int)_finalize == iVar33);
      auVar46._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar50._4_4_ = auVar46._0_4_;
      auVar50._0_4_ = auVar46._4_4_;
      auVar50._8_4_ = auVar46._12_4_;
      auVar50._12_4_ = auVar46._8_4_;
      auVar38._0_4_ = -(uint)((int)_finalize == iVar33);
      auVar38._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar38._8_4_ = -(uint)((int)UINT16ARRAY == iVar33);
      auVar38._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar34);
      auVar47._4_4_ = auVar38._0_4_;
      auVar47._0_4_ = auVar38._4_4_;
      auVar47._8_4_ = auVar38._12_4_;
      auVar47._12_4_ = auVar38._8_4_;
      auVar45 = packssdw(auVar47 & auVar38,auVar50 & auVar46);
      auVar31._0_4_ = -(uint)((int)_parseExpression == iVar33);
      auVar31._4_4_ = -(uint)((int)((ulong)_parseExpression >> 0x20) == iVar34);
      auVar31._8_4_ = -(uint)((int)_visitSIMDShift == iVar33);
      auVar31._12_4_ = -(uint)((int)((ulong)_visitSIMDShift >> 0x20) == iVar34);
      auVar39._4_4_ = auVar31._0_4_;
      auVar39._0_4_ = auVar31._4_4_;
      auVar39._8_4_ = auVar31._12_4_;
      auVar39._12_4_ = auVar31._8_4_;
      auVar26._0_4_ = -(uint)((int)_finalize == iVar33);
      auVar26._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar34);
      auVar26._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar33);
      auVar26._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar34);
      auVar32._4_4_ = auVar26._0_4_;
      auVar32._0_4_ = auVar26._4_4_;
      auVar32._8_4_ = auVar26._12_4_;
      auVar32._12_4_ = auVar26._8_4_;
      auVar28 = packssdw(auVar32 & auVar26,auVar39 & auVar31);
      auVar28 = packssdw(auVar28,auVar45);
      if (((((((((((auVar28 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar28 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar28 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar28 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar28[0xf]) && (cashew::TRSHIFT != pcVar8)) &&
          ((cashew::SET != pcVar8 && ((_visitRefTest != pcVar8 && (_Init != pcVar8)))))) &&
         ((_finalize != pcVar8 && (pMVar19 = (Module *)&ABI::wasm2js::TRAP, __M_create != pcVar8))))
      {
        pNVar1 = (Name *)((long)&(_Var12._M_head_impl)->super_Importable + 0x18);
        sVar18 = std::
                 _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)local_f8,pNVar1);
        if (sVar18 == 0) {
          pOVar5 = local_58->out;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(pOVar5 + 0x200),"  \"",3);
          name_01.super_IString.str._M_str = (char *)pMVar19;
          name_01.super_IString.str._M_len =
               (size_t)*(char **)((long)&(_Var12._M_head_impl)->super_Importable + 0x20);
          poVar17 = wasm::operator<<((wasm *)(pOVar5 + 0x200),
                                     *(ostream **)
                                      &((Name *)((long)&(_Var12._M_head_impl)->super_Importable +
                                                0x18))->super_IString,name_01);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\": ",3);
          pcVar8 = *(char **)((long)&(_Var12._M_head_impl)->super_Importable + 0x20);
          local_50 = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar8,
                     pcVar8 + *(long *)&((Name *)((long)&(_Var12._M_head_impl)->super_Importable +
                                                 0x18))->super_IString);
          ::wasm::asmangle(&local_270,&local_50);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,(char *)local_270,_export_name);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,",\n",2);
          if (local_270 !=
              (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          local_270 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)local_f8;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    (local_270,pNVar1,&local_270);
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_58->out + 0x200),"});\n",4);
  if ((pWVar16->flags).allowAsserts == false) {
    pMVar13 = pWVar16->wasm;
    puVar20 = (pMVar13->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = (pMVar13->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar20 != local_a0) {
      do {
        EVar4 = ((puVar20->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind;
        if (((uint)EVar4 < 4) && (EVar4 != Table)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_270);
          _Var14._M_head_impl =
               (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          lVar15 = *(long *)&(_Var14._M_head_impl)->name;
          if (lVar15 != 0) {
            pcVar8 = *(char **)((long)&(_Var14._M_head_impl)->name + 8);
            lVar22 = 0;
            do {
              cVar3 = pcVar8[lVar22];
              if (cVar3 == '-') {
                local_50 = (long *)CONCAT71(local_50._1_7_,0x5f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_270,(char *)&local_50,1);
              }
              else {
                local_50 = (long *)CONCAT71(local_50._1_7_,cVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_270,(char *)&local_50,1);
              }
              lVar22 = lVar22 + 1;
            } while (lVar15 != lVar22);
          }
          pWVar16 = local_58;
          pOVar5 = local_58->out;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(pOVar5 + 0x200),"export var ",0xb);
          _Var14._M_head_impl =
               (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar8 = *(char **)((long)&(_Var14._M_head_impl)->name + 8);
          pp_Var2 = &seenModules._M_h._M_single_bucket;
          seenModules._M_h._M_single_bucket = local_b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)pp_Var2,pcVar8,pcVar8 + *(long *)&(_Var14._M_head_impl)->name);
          ::wasm::asmangle(&local_50,pp_Var2);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(pOVar5 + 0x200),(char *)local_50,local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17," = ret",6);
          name_02.super_IString.str._M_str = (char *)pMVar19;
          name_02.super_IString.str._M_len = (size_t)(pWVar16->moduleName).super_IString.str._M_str;
          poVar17 = wasm::operator<<((wasm *)poVar17,
                                     (ostream *)(pWVar16->moduleName).super_IString.str._M_len,
                                     name_02);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,".",1);
          _Var14._M_head_impl =
               (puVar20->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          pcVar8 = *(char **)((long)&(_Var14._M_head_impl)->name + 8);
          local_78[0] = local_68;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_78,pcVar8,pcVar8 + *(long *)&(_Var14._M_head_impl)->name);
          ::wasm::asmangle(&local_98,(string *)local_78);
          poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar17,(char *)local_98,local_90);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,";\n",2);
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0],local_68[0] + 1);
          }
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (seenModules._M_h._M_single_bucket != local_b0) {
            operator_delete(seenModules._M_h._M_single_bucket,
                            (ulong)((long)&(local_b0[0]._M_nxt)->_M_nxt + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_270);
          std::ios_base::~ios_base(local_200);
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != local_a0);
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_f8);
  return;
}

Assistant:

void Wasm2JSGlue::emitPostES6() {
  // Create an initial `ArrayBuffer` and populate it with static data.
  // Currently we use base64 encoding to encode static data and we decode it at
  // instantiation time.
  //
  // Note that the translation here expects that the lower values of this memory
  // can be used for conversions, so make sure there's at least one page.
  if (!wasm.memories.empty() && wasm.memories[0]->imported()) {
    out << "var mem" << moduleName.str << " = new ArrayBuffer("
        << wasm.memories[0]->initial.addr * Memory::kPageSize << ");\n";
  }

  // Actually invoke the `asmFunc` generated function, passing in all global
  // values followed by all imports
  out << "var ret" << moduleName.str << " = " << moduleName.str << "({\n";

  std::unordered_set<Name> seenModules;

  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  ModuleUtils::iterImportedMemories(wasm, [&](Memory* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    out << "  \"" << import->module << "\": {\n";
    out << "    " << asmangle(import->base.toString()) << ": { buffer : mem"
        << moduleName.str << " }\n";
    out << "  },\n";
  });

  ModuleUtils::iterImportedTables(wasm, [&](Table* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    if (seenModules.count(import->module) > 0) {
      return;
    }
    out << "  \"" << import->module
        << "\": " << asmangle(import->module.toString()) << ",\n";
    seenModules.insert(import->module);
  });

  out << "});\n";

  if (flags.allowAsserts) {
    return;
  }

  // And now that we have our returned instance, export all our functions
  // that are hanging off it.
  for (auto& exp : wasm.exports) {
    switch (exp->kind) {
      case ExternalKind::Function:
      case ExternalKind::Global:
      case ExternalKind::Memory:
        break;

      // Exported globals and function tables aren't supported yet
      default:
        continue;
    }
    std::ostringstream export_name;
    for (char c : exp->name.str) {
      if (c == '-') {
        export_name << '_';
      } else {
        export_name << c;
      }
    }
    out << "export var " << asmangle(exp->name.toString()) << " = ret"
        << moduleName << "." << asmangle(exp->name.toString()) << ";\n";
  }
}